

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.h
# Opt level: O3

Shape * __thiscall
Shape::rotate(Shape *this,double degreeZ,Point<double> *center,double degreeX,double degreeY)

{
  long lVar1;
  long lVar2;
  
  if (0 < this->size) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Polygon::rotate(degreeZ,(Point *)(this->polygons + lVar2),degreeX,degreeY);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x50;
    } while (lVar1 < this->size);
  }
  Point<double>::rotate(&this->center,degreeZ,center,degreeX,degreeY);
  return this;
}

Assistant:

Shape& rotate(double degreeZ, const Point<double>& center = Point<double>(0, 0), double degreeX = 0, double degreeY = 0) {
    for (int i = 0; i < size; ++i) {
      polygons[i].rotate(degreeZ, center, degreeX, degreeY);
    }
    this->center.rotate(degreeZ, center, degreeX, degreeY);
    
    return *this;
  }